

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O0

int fl_utf_nb_char(uchar *buf,int len)

{
  int local_20;
  int local_1c;
  int cl;
  int nbc;
  int i;
  int len_local;
  uchar *buf_local;
  
  local_1c = 0;
  for (cl = 0; cl < len; cl = local_20 + cl) {
    local_20 = fl_utf8len(buf[cl]);
    if (local_20 < 1) {
      local_20 = 1;
    }
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

int
fl_utf_nb_char(
	const unsigned char 	*buf,
	int 			len)
{
  int i = 0;
  int nbc = 0;
  while (i < len) {
    int cl = fl_utf8len((buf+i)[0]);
    if (cl < 1) cl = 1;
    nbc++;
    i += cl;
  }
  return nbc;
}